

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wifi_impl.cpp
# Opt level: O2

Element __thiscall ui::anon_unknown_0::WiFiImpl::Render(WiFiImpl *this)

{
  bool bVar1;
  int __fd;
  int iVar2;
  int *piVar3;
  string *psVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  char *pcVar5;
  long lVar6;
  long in_RSI;
  WiFiImpl *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  Element EVar8;
  initializer_list<std::shared_ptr<ftxui::Node>_> __l;
  initializer_list<std::shared_ptr<ftxui::Node>_> __l_00;
  initializer_list<std::shared_ptr<ftxui::Node>_> __l_01;
  initializer_list<std::shared_ptr<ftxui::Node>_> __l_02;
  initializer_list<std::shared_ptr<ftxui::Node>_> __l_03;
  initializer_list<std::shared_ptr<ftxui::Node>_> __l_04;
  initializer_list<std::shared_ptr<ftxui::Node>_> __l_05;
  allocator<char> local_24f;
  allocator_type local_24e;
  allocator<char> local_24d;
  allocator_type local_24c;
  allocator_type local_24b;
  allocator_type local_24a;
  allocator_type local_249;
  iwreq wlan_ioctl_req;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  undefined1 local_1c0 [16];
  code *local_1b0;
  code *local_1a8;
  vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> local_1a0;
  vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> local_188;
  undefined1 local_170 [24];
  vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> local_158;
  vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> local_140;
  undefined1 local_128 [16];
  char active_wlan_id [33];
  ftxui local_e8 [24];
  Decorator local_d0;
  Decorator local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> current_network;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (*(char *)(in_RSI + 0x249) != '\x01') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"Feature not supported",(allocator<char> *)active_wlan_id);
    ftxui::text((string *)this);
    pbVar7 = &local_70;
    goto LAB_0012704d;
  }
  while (bVar1 = ftxui::
                 ReceiverImpl<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::HasPending(*(ReceiverImpl<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                **)(in_RSI + 0x270)), bVar1) {
    ftxui::
    ReceiverImpl<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::Receive(*(ReceiverImpl<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                **)(in_RSI + 0x270),
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(in_RSI + 0x230));
  }
  if (*(int *)(in_RSI + 0x2c) == 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&current_network,"Network : ",&local_24d);
    ftxui::text((string *)local_200);
    std::__cxx11::string::string
              ((string *)&local_1e0,
               (string *)((long)*(int *)(in_RSI + 0x28) * 0x20 + *(long *)(in_RSI + 0x230)));
    ftxui::text((string *)(local_200 + 0x10));
    __l._M_len = 2;
    __l._M_array = (iterator)local_200;
    std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::
    vector((vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> *)
           local_170,__l,&local_24e);
    ftxui::hbox((Elements *)local_220);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"Password: ",&local_24f);
    EVar8 = ftxui::text((string *)local_1c0);
    (**(code **)(**(long **)(in_RSI + 0x1e0) + 0x10))
              (&local_1b0,*(long **)(in_RSI + 0x1e0),
               EVar8.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
               _M_pi);
    __l_00._M_len = 2;
    __l_00._M_array = (iterator)local_1c0;
    std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::
    vector(&local_188,__l_00,&local_249);
    ftxui::hbox((Elements *)(local_220 + 0x10));
    __l_01._M_len = 2;
    __l_01._M_array = (iterator)local_220;
    std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::
    vector((vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> *)
           (local_170 + 0x18),__l_01,&local_24a);
    EVar8 = ftxui::vbox((Elements *)&wlan_ioctl_req);
    (**(code **)(**(long **)(in_RSI + 0x1f0) + 0x10))
              (active_wlan_id,*(long **)(in_RSI + 0x1f0),
               EVar8.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
               _M_pi);
    (**(code **)(**(long **)(in_RSI + 0x200) + 0x10))(active_wlan_id + 0x10);
    (**(code **)(**(long **)(in_RSI + 0x210) + 0x10))(active_wlan_id + 0x20);
    __l_02._M_len = 3;
    __l_02._M_array = (iterator)active_wlan_id;
    std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::
    vector(&local_1a0,__l_02,&local_24b);
    ftxui::hbox((Elements *)&wlan_ioctl_req.u.essid);
    __l_03._M_len = 2;
    __l_03._M_array = (iterator)&wlan_ioctl_req;
    std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::
    vector(&local_140,__l_03,&local_24c);
    ftxui::vbox((Elements *)local_128);
    local_d0.super__Function_base._M_functor._8_8_ = 0;
    local_d0.super__Function_base._M_functor._M_unused._M_object = ftxui::nothing;
    local_d0._M_invoker =
         std::
         _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
         ::_M_invoke;
    local_d0.super__Function_base._M_manager =
         std::
         _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
         ::_M_manager;
    ftxui::operator|((ftxui *)this,(Element *)local_128,&local_d0);
    std::_Function_base::~_Function_base(&local_d0.super__Function_base);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_128 + 8));
    std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::
    ~vector(&local_140);
    lVar6 = 0x18;
    do {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&wlan_ioctl_req.ifr_ifrn + lVar6));
      lVar6 = lVar6 + -0x10;
    } while (lVar6 != -8);
    std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::
    ~vector(&local_1a0);
    lVar6 = 0x28;
    do {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(active_wlan_id + lVar6));
      lVar6 = lVar6 + -0x10;
    } while (lVar6 != -8);
    std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::
    ~vector((vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> *)
            (local_170 + 0x18));
    lVar6 = 0x18;
    do {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_220 + lVar6));
      lVar6 = lVar6 + -0x10;
    } while (lVar6 != -8);
    std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::
    ~vector(&local_188);
    lVar6 = 0x18;
    do {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1c0 + lVar6));
      lVar6 = lVar6 + -0x10;
    } while (lVar6 != -8);
    std::__cxx11::string::~string((string *)&local_b0);
    std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::
    ~vector((vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> *)
            local_170);
    lVar6 = 0x18;
    do {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_200 + lVar6));
      lVar6 = lVar6 + -0x10;
    } while (lVar6 != -8);
    pbVar7 = &local_1e0;
  }
  else {
    if (*(int *)(in_RSI + 0x2c) != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"Not implemented",(allocator<char> *)active_wlan_id);
      ftxui::text((string *)this);
      pbVar7 = &local_50;
      goto LAB_0012704d;
    }
    this_00 = (WiFiImpl *)(in_RSI + 0x250);
    std::__cxx11::string::assign((char *)this_00);
    bVar1 = WifiStatus(this_00);
    wlan_ioctl_req.u.essid.pointer = (void *)0x0;
    wlan_ioctl_req.ifr_ifrn._8_8_ = 0;
    wlan_ioctl_req.u._8_8_ = 0x21;
    wlan_ioctl_req.ifr_ifrn._0_8_ = 0x306e616c77;
    __fd = socket(2,2,0);
    if (__fd == -1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_200,"Error: ",(allocator<char> *)local_1c0);
      piVar3 = __errno_location();
      pcVar5 = strerror(*piVar3);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200,
                     *pcVar5);
      psVar4 = (string *)
               std::__cxx11::string::operator=((string *)(in_RSI + 0x2c0),(string *)local_220);
      std::__cxx11::string::string((string *)&local_1e0,psVar4);
LAB_00126d65:
      std::__cxx11::string::~string((string *)local_220);
      std::__cxx11::string::~string((string *)local_200);
    }
    else {
      wlan_ioctl_req.u.essid.pointer = active_wlan_id;
      iVar2 = ioctl(__fd,0x8b1b);
      if (iVar2 == -1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_200,"Error: ",(allocator<char> *)local_1c0);
        piVar3 = __errno_location();
        pcVar5 = strerror(*piVar3);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_220,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_200,*pcVar5);
        psVar4 = (string *)
                 std::__cxx11::string::operator=((string *)(in_RSI + 0x2c0),(string *)local_220);
        std::__cxx11::string::string((string *)&local_1e0,psVar4);
        goto LAB_00126d65;
      }
      close(__fd);
      psVar4 = (string *)(in_RSI + 0x2c0);
      std::__cxx11::string::assign((char *)psVar4);
      if (*(long *)(in_RSI + 0x2c8) == 0) {
        psVar4 = (string *)std::__cxx11::string::assign((char *)psVar4);
      }
      std::__cxx11::string::string((string *)&local_1e0,psVar4);
    }
    std::operator+(&current_network,"Current Network: ",&local_1e0);
    pcVar5 = "WiFi Status : Disabled";
    if (bVar1) {
      pcVar5 = "WiFi Status : Enabled";
    }
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&wlan_ioctl_req,pcVar5,(allocator<char> *)local_128);
    ftxui::text((string *)active_wlan_id);
    std::__cxx11::string::string((string *)local_220,(string *)&current_network);
    EVar8 = ftxui::text((string *)(active_wlan_id + 0x10));
    (**(code **)(**(long **)(in_RSI + 0x220) + 0x10))
              (local_200,*(long **)(in_RSI + 0x220),
               EVar8.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
               _M_pi);
    (**(code **)(**(long **)(in_RSI + 0xf0) + 0x10))(local_200 + 0x10);
    __l_04._M_len = 2;
    __l_04._M_array = (iterator)local_200;
    std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::
    vector(&local_140,__l_04,(allocator_type *)&local_24d);
    ftxui::hbox((Elements *)(active_wlan_id + 0x20));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e0,"Network",(allocator<char> *)&local_24e);
    EVar8 = ftxui::text((string *)local_170);
    (**(code **)(**(long **)(in_RSI + 0x100) + 0x10))
              (&local_1a0,*(long **)(in_RSI + 0x100),
               EVar8.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
               _M_pi);
    local_1c0._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1c0._0_8_ = ftxui::yframe;
    local_1a8 = std::
                _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
                ::_M_invoke;
    local_1b0 = std::
                _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
                ::_M_manager;
    ftxui::operator|((ftxui *)&local_188,(Element *)&local_1a0,(Decorator *)local_1c0);
    ftxui::window(local_e8,(Element *)local_170,(Element *)&local_188);
    __l_05._M_len = 4;
    __l_05._M_array = (iterator)active_wlan_id;
    std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::
    vector((vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> *)
           &local_d0,__l_05,(allocator_type *)&local_24f);
    ftxui::vbox((Elements *)(local_170 + 0x18));
    local_b0.super__Function_base._M_functor._8_8_ = 0;
    local_b0.super__Function_base._M_functor._M_unused._M_object = ftxui::flex;
    local_b0._M_invoker =
         std::
         _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
         ::_M_invoke;
    local_b0.super__Function_base._M_manager =
         std::
         _Function_handler<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>),_std::shared_ptr<ftxui::Node>_(*)(std::shared_ptr<ftxui::Node>)>
         ::_M_manager;
    ftxui::operator|((ftxui *)this,(Element *)(local_170 + 0x18),&local_b0);
    std::_Function_base::~_Function_base(&local_b0.super__Function_base);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&local_158.
                       super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
                       ._M_impl.super__Vector_impl_data + 8));
    std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::
    ~vector((vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> *)
            &local_d0);
    lVar6 = 0x38;
    do {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(active_wlan_id + lVar6));
      lVar6 = lVar6 + -0x10;
    } while (lVar6 != -8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_188.
                super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
                ._M_impl.super__Vector_impl_data._M_finish);
    std::_Function_base::~_Function_base((_Function_base *)local_1c0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_1a0.
                super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
                ._M_impl.super__Vector_impl_data._M_finish);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_170 + 8));
    std::__cxx11::string::~string((string *)&local_1e0);
    std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::
    ~vector(&local_140);
    lVar6 = 0x18;
    do {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_200 + lVar6));
      lVar6 = lVar6 + -0x10;
    } while (lVar6 != -8);
    std::__cxx11::string::~string((string *)local_220);
    pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&wlan_ioctl_req;
  }
  std::__cxx11::string::~string((string *)pbVar7);
  pbVar7 = &current_network;
LAB_0012704d:
  std::__cxx11::string::~string((string *)pbVar7);
  EVar8.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  EVar8.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Element)EVar8.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Element Render() override {
    if (wifiCompatiblity) {
      while (wifi_list_receiver_->HasPending())
        wifi_list_receiver_->Receive(&wifi_list_);

      if (activity == ActivityMain)
        return RenderMain();

      if (activity == ActivityConnect)
        return RenderConnect();

      return text("Not implemented");
    } else {
      return text("Feature not supported");
    }
  }